

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O3

void p_crypto_hash_gost3411_update(PHashGOST3411 *ctx,puchar *data,psize len)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  puint i;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong __n;
  puint32 len256 [8];
  uint auStack_88 [14];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong uVar10;
  
  uVar9 = ctx->len[0] >> 3 & 0x1f;
  uVar10 = (ulong)uVar9;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = CONCAT44((int)(len >> 0x1d),(uint)len * 8);
  lVar5 = 0x10;
  uVar6 = 0;
  do {
    uVar8 = ctx->buf[lVar5];
    uVar6 = uVar6 + uVar8;
    uVar1 = auStack_88[lVar5];
    uVar7 = uVar6 + auStack_88[lVar5];
    ctx->buf[lVar5] = uVar7;
    uVar6 = (uint)(uVar7 < uVar8 || CARRY4(uVar6,uVar1));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x18);
  if (uVar9 != 0) {
    if ((uint)len < 0x20 - uVar9) goto joined_r0x0010c08a;
    __n = (ulong)(0x20 - uVar9);
    uStack_50 = 0x10c043;
    memcpy((void *)((long)ctx->buf + uVar10),data,__n);
    uStack_50 = 0x10c04e;
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar9 = ctx->sum[lVar5];
      uVar6 = uVar6 + uVar9;
      uVar8 = uVar6 + ctx->buf[lVar5];
      ctx->sum[lVar5] = uVar8;
      uVar6 = (uint)(uVar8 < uVar9 || CARRY4(uVar6,ctx->buf[lVar5]));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    data = data + __n;
    len = len - __n;
  }
  uVar10 = 0;
joined_r0x0010c08a:
  for (; 0x1f < len; len = len - 0x20) {
    uVar2 = *(undefined8 *)data;
    uVar3 = *(undefined8 *)(data + 8);
    uVar4 = *(undefined8 *)(data + 0x18);
    *(undefined8 *)(ctx->buf + 4) = *(undefined8 *)(data + 0x10);
    *(undefined8 *)(ctx->buf + 6) = uVar4;
    *(undefined8 *)ctx->buf = uVar2;
    *(undefined8 *)(ctx->buf + 2) = uVar3;
    uStack_50 = 0x10c0a9;
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar9 = ctx->sum[lVar5];
      uVar6 = uVar6 + uVar9;
      uVar8 = uVar6 + ctx->buf[lVar5];
      ctx->sum[lVar5] = uVar8;
      uVar6 = (uint)(uVar8 < uVar9 || CARRY4(uVar6,ctx->buf[lVar5]));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    data = data + 0x20;
  }
  if (len != 0) {
    memcpy((void *)((long)ctx->buf + uVar10),data,len);
    return;
  }
  return;
}

Assistant:

void
p_crypto_hash_gost3411_update (PHashGOST3411	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;
	puint32	len256[8];

	left = (ctx->len[0] & 0xFF) >> 3;
	to_fill = 32 - left;

	memset (len256, 0, 32);
	len256[0] = (puint32) (len << 3);
	len256[1] = (puint32) (len >> 29);

	pp_crypto_hash_gost3411_sum_256 (ctx->len, len256);

	if (left && (puint32) len >= to_fill) {
		memcpy ((pchar *) ctx->buf + left, data, to_fill);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 32) {
		memcpy (ctx->buf, data, 32);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += 32;
		len -= 32;
	}

	if (len > 0)
		memcpy ((pchar *) ctx->buf + left, data, len);
}